

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O3

ARKodeSPRKTable arkodeSymplecticLeapfrog2(void)

{
  sunrealtype *psVar1;
  ARKodeSPRKTable pAVar2;
  
  pAVar2 = ARKodeSPRKTable_Alloc(2);
  if (pAVar2 != (ARKodeSPRKTable)0x0) {
    pAVar2->q = 2;
    pAVar2->stages = 2;
    psVar1 = pAVar2->a;
    *psVar1 = 0.5;
    psVar1[1] = 0.5;
    psVar1 = pAVar2->ahat;
    *(undefined4 *)psVar1 = 0;
    *(undefined4 *)((long)psVar1 + 4) = 0;
    *(undefined4 *)(psVar1 + 1) = 0;
    *(undefined4 *)((long)psVar1 + 0xc) = 0x3ff00000;
  }
  return pAVar2;
}

Assistant:

static ARKodeSPRKTable arkodeSymplecticLeapfrog2(void)
{
  ARKodeSPRKTable sprk_table = ARKodeSPRKTable_Alloc(2);
  if (!sprk_table) { return NULL; }
  sprk_table->q       = 2;
  sprk_table->stages  = 2;
  sprk_table->a[0]    = SUN_RCONST(0.5);
  sprk_table->a[1]    = SUN_RCONST(0.5);
  sprk_table->ahat[0] = SUN_RCONST(0.0);
  sprk_table->ahat[1] = SUN_RCONST(1.0);
  return sprk_table;
}